

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::DynamicMapField::SyncMapWithRepeatedFieldNoLock(DynamicMapField *this)

{
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this_00;
  Arena *pAVar1;
  bool value;
  string sVar2;
  int iVar3;
  CppType CVar4;
  uint32 uVar5;
  int32 value_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RepeatedPtrField<google::protobuf::Message> *pRVar6;
  LogMessage *other;
  uint64 uVar7;
  int64 value_01;
  MapValueRef *pMVar8;
  Message *pMVar9;
  undefined4 extraout_var_01;
  string *this_01;
  Rep *pRVar10;
  Reflection *extraout_RDX;
  void **ppvVar11;
  void **ppvVar12;
  float fVar13;
  double dVar14;
  undefined1 local_e0 [8];
  MapKey map_key;
  undefined1 local_98 [8];
  iterator iter;
  LogFinisher local_51;
  FieldDescriptor *local_50;
  FieldDescriptor *local_48;
  DynamicMapField *local_40;
  Reflection *local_38;
  
  this_00 = &this->map_;
  (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x13])();
  local_38 = extraout_RDX;
  iVar3 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x13])();
  local_50 = Descriptor::map_key((Descriptor *)CONCAT44(extraout_var,iVar3));
  iVar3 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x13])();
  local_48 = Descriptor::map_value((Descriptor *)CONCAT44(extraout_var_00,iVar3));
  if ((this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
      .super_MapFieldBase.arena_ == (Arena *)0x0) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
              ((iterator *)local_98,this_00);
    while (local_98 != (undefined1  [8])0x0) {
      MapValueRef::DeleteData((MapValueRef *)(*(long *)((long)local_98 + 8) + 0x28));
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
      iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
      ::operator++((iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                    *)local_98);
    }
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear(this_00);
  pRVar6 = (this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.repeated_field_;
  pRVar10 = (pRVar6->super_RepeatedPtrFieldBase).rep_;
  ppvVar12 = pRVar10->elements;
  if (pRVar10 == (Rep *)0x0) {
    ppvVar12 = (void **)0x0;
  }
  local_40 = this;
  do {
    ppvVar11 = pRVar10->elements;
    if (pRVar10 == (Rep *)0x0) {
      ppvVar11 = (void **)0x0;
    }
    if (ppvVar12 == ppvVar11 + (pRVar6->super_RepeatedPtrFieldBase).current_size_) {
      return;
    }
    map_key.val_._24_4_ = 0;
    CVar4 = FieldDescriptor::cpp_type(local_50);
    switch(CVar4) {
    case CPPTYPE_INT32:
      value_00 = Reflection::GetInt32(local_38,(Message *)*ppvVar12,local_50);
      MapKey::SetInt32Value((MapKey *)local_e0,value_00);
      break;
    case CPPTYPE_INT64:
      value_01 = Reflection::GetInt64(local_38,(Message *)*ppvVar12,local_50);
      MapKey::SetInt64Value((MapKey *)local_e0,value_01);
      break;
    case CPPTYPE_UINT32:
      uVar5 = Reflection::GetUInt32(local_38,(Message *)*ppvVar12,local_50);
      MapKey::SetUInt32Value((MapKey *)local_e0,uVar5);
      break;
    case CPPTYPE_UINT64:
      uVar7 = Reflection::GetUInt64(local_38,(Message *)*ppvVar12,local_50);
      MapKey::SetUInt64Value((MapKey *)local_e0,uVar7);
      break;
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
    case CPPTYPE_MESSAGE:
      LogMessage::LogMessage
                ((LogMessage *)local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/map_field.cc"
                 ,0x1e7);
      other = LogMessage::operator<<((LogMessage *)local_98,"Can\'t get here.");
      LogFinisher::operator=(&local_51,other);
      LogMessage::~LogMessage((LogMessage *)local_98);
      break;
    case CPPTYPE_BOOL:
      value = Reflection::GetBool(local_38,(Message *)*ppvVar12,local_50);
      MapKey::SetBoolValue((MapKey *)local_e0,value);
      break;
    case CPPTYPE_STRING:
      Reflection::GetString_abi_cxx11_
                ((string *)&map_key.type_,local_38,(Message *)*ppvVar12,local_50);
      MapKey::SetStringValue((MapKey *)local_e0,(string *)&map_key.type_);
      std::__cxx11::string::~string((string *)&map_key.type_);
    }
    if (((local_40->
         super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
         super_MapFieldBase.arena_ == (Arena *)0x0) &&
       (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find
                  ((iterator *)local_98,this_00,(MapKey *)local_e0),
       local_98 != (undefined1  [8])0x0)) {
      MapValueRef::DeleteData((MapValueRef *)(*(long *)((long)local_98 + 8) + 0x28));
    }
    pMVar8 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                       (this_00,(MapKey *)local_e0);
    CVar4 = FieldDescriptor::cpp_type(local_48);
    pMVar8->type_ = CVar4;
    CVar4 = FieldDescriptor::cpp_type(local_48);
    switch(CVar4) {
    case CPPTYPE_INT32:
      pAVar1 = (local_40->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.arena_;
      if (pAVar1 == (Arena *)0x0) {
        this_01 = (string *)operator_new(4);
      }
      else {
        Arena::AllocHook(pAVar1,(type_info *)&int::typeinfo,8);
        this_01 = (string *)Arena::AllocateAlignedNoHook(pAVar1,8);
      }
      *(uint32 *)this_01 = 0;
      uVar5 = Reflection::GetInt32(local_38,(Message *)*ppvVar12,local_48);
      goto LAB_0030075d;
    case CPPTYPE_INT64:
      pAVar1 = (local_40->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.arena_;
      if (pAVar1 == (Arena *)0x0) {
        this_01 = (string *)operator_new(8);
      }
      else {
        Arena::AllocHook(pAVar1,(type_info *)&long::typeinfo,8);
        this_01 = (string *)Arena::AllocateAlignedNoHook(pAVar1,8);
      }
      *(uint64 *)this_01 = 0;
      uVar7 = Reflection::GetInt64(local_38,(Message *)*ppvVar12,local_48);
      goto LAB_00300785;
    case CPPTYPE_UINT32:
      pAVar1 = (local_40->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.arena_;
      if (pAVar1 == (Arena *)0x0) {
        this_01 = (string *)operator_new(4);
      }
      else {
        Arena::AllocHook(pAVar1,(type_info *)&unsigned_int::typeinfo,8);
        this_01 = (string *)Arena::AllocateAlignedNoHook(pAVar1,8);
      }
      *(uint32 *)this_01 = 0;
      uVar5 = Reflection::GetUInt32(local_38,(Message *)*ppvVar12,local_48);
      goto LAB_0030075d;
    case CPPTYPE_UINT64:
      pAVar1 = (local_40->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.arena_;
      if (pAVar1 == (Arena *)0x0) {
        this_01 = (string *)operator_new(8);
      }
      else {
        Arena::AllocHook(pAVar1,(type_info *)&unsigned_long::typeinfo,8);
        this_01 = (string *)Arena::AllocateAlignedNoHook(pAVar1,8);
      }
      *(uint64 *)this_01 = 0;
      uVar7 = Reflection::GetUInt64(local_38,(Message *)*ppvVar12,local_48);
LAB_00300785:
      *(uint64 *)this_01 = uVar7;
      break;
    case CPPTYPE_DOUBLE:
      pAVar1 = (local_40->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.arena_;
      if (pAVar1 == (Arena *)0x0) {
        this_01 = (string *)operator_new(8);
      }
      else {
        Arena::AllocHook(pAVar1,(type_info *)&double::typeinfo,8);
        this_01 = (string *)Arena::AllocateAlignedNoHook(pAVar1,8);
      }
      *(uint64 *)this_01 = 0;
      dVar14 = Reflection::GetDouble(local_38,(Message *)*ppvVar12,local_48);
      *(double *)this_01 = dVar14;
      break;
    case CPPTYPE_FLOAT:
      pAVar1 = (local_40->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.arena_;
      if (pAVar1 == (Arena *)0x0) {
        this_01 = (string *)operator_new(4);
      }
      else {
        Arena::AllocHook(pAVar1,(type_info *)&float::typeinfo,8);
        this_01 = (string *)Arena::AllocateAlignedNoHook(pAVar1,8);
      }
      *(uint32 *)this_01 = 0;
      fVar13 = Reflection::GetFloat(local_38,(Message *)*ppvVar12,local_48);
      *(float *)this_01 = fVar13;
      break;
    case CPPTYPE_BOOL:
      pAVar1 = (local_40->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.arena_;
      if (pAVar1 == (Arena *)0x0) {
        this_01 = (string *)operator_new(1);
      }
      else {
        Arena::AllocHook(pAVar1,(type_info *)&bool::typeinfo,8);
        this_01 = (string *)Arena::AllocateAlignedNoHook(pAVar1,8);
      }
      *this_01 = (string)0x0;
      sVar2 = (string)Reflection::GetBool(local_38,(Message *)*ppvVar12,local_48);
      *this_01 = sVar2;
      break;
    case CPPTYPE_ENUM:
      pAVar1 = (local_40->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.arena_;
      if (pAVar1 == (Arena *)0x0) {
        this_01 = (string *)operator_new(4);
      }
      else {
        Arena::AllocHook(pAVar1,(type_info *)&int::typeinfo,8);
        this_01 = (string *)Arena::AllocateAlignedNoHook(pAVar1,8);
      }
      *(uint32 *)this_01 = 0;
      uVar5 = Reflection::GetEnumValue(local_38,(Message *)*ppvVar12,local_48);
LAB_0030075d:
      *(uint32 *)this_01 = uVar5;
      break;
    case CPPTYPE_STRING:
      pAVar1 = (local_40->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.arena_;
      if (pAVar1 == (Arena *)0x0) {
        this_01 = (string *)operator_new(0x20);
      }
      else {
        Arena::AllocHook(pAVar1,(type_info *)&std::__cxx11::string::typeinfo,0x20);
        this_01 = (string *)
                  ArenaImpl::AllocateAlignedAndAddCleanup
                            (&pAVar1->impl_,0x20,arena_destruct_object<std::__cxx11::string>);
      }
      *(string **)this_01 = this_01 + 0x10;
      *(undefined8 *)(this_01 + 8) = 0;
      this_01[0x10] = (string)0x0;
      Reflection::GetString_abi_cxx11_((string *)local_98,local_38,(Message *)*ppvVar12,local_48);
      std::__cxx11::string::operator=(this_01,(string *)local_98);
      std::__cxx11::string::~string((string *)local_98);
      break;
    case CPPTYPE_MESSAGE:
      pMVar9 = Reflection::GetMessage(local_38,(Message *)*ppvVar12,local_48,(MessageFactory *)0x0);
      iVar3 = (*(pMVar9->super_MessageLite)._vptr_MessageLite[4])
                        (pMVar9,(local_40->
                                super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                ).super_MapFieldBase.arena_);
      this_01 = (string *)CONCAT44(extraout_var_01,iVar3);
      (**(code **)(*(uint64 *)this_01 + 0x70))(this_01,pMVar9);
      break;
    default:
      goto switchD_0030049c_default;
    }
    pMVar8->data_ = this_01;
switchD_0030049c_default:
    MapKey::~MapKey((MapKey *)local_e0);
    ppvVar12 = ppvVar12 + 1;
    pRVar6 = (local_40->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.repeated_field_;
    pRVar10 = (pRVar6->super_RepeatedPtrFieldBase).rep_;
  } while( true );
}

Assistant:

void DynamicMapField::SyncMapWithRepeatedFieldNoLock() const {
  Map<MapKey, MapValueRef>* map = &const_cast<DynamicMapField*>(this)->map_;
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des = default_entry_->GetDescriptor()->map_key();
  const FieldDescriptor* val_des = default_entry_->GetDescriptor()->map_value();
  // DynamicMapField owns map values. Need to delete them before clearing
  // the map.
  if (MapFieldBase::arena_ == nullptr) {
    for (Map<MapKey, MapValueRef>::iterator iter = map->begin();
         iter != map->end(); ++iter) {
      iter->second.DeleteData();
    }
  }
  map->clear();
  for (RepeatedPtrField<Message>::iterator it =
           MapFieldBase::repeated_field_->begin();
       it != MapFieldBase::repeated_field_->end(); ++it) {
    // MapKey type will be set later.
    MapKey map_key;
    switch (key_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        map_key.SetStringValue(reflection->GetString(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        map_key.SetInt64Value(reflection->GetInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        map_key.SetInt32Value(reflection->GetInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        map_key.SetUInt64Value(reflection->GetUInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        map_key.SetUInt32Value(reflection->GetUInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        map_key.SetBoolValue(reflection->GetBool(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }

    if (MapFieldBase::arena_ == nullptr) {
      // Remove existing map value with same key.
      Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
      if (iter != map->end()) {
        iter->second.DeleteData();
      }
    }

    MapValueRef& map_val = (*map)[map_key];
    map_val.SetType(val_des->cpp_type());
    switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE, METHOD)                   \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: {                 \
    TYPE* value = Arena::Create<TYPE>(MapFieldBase::arena_); \
    *value = reflection->Get##METHOD(*it, val_des);          \
    map_val.SetValue(value);                                 \
    break;                                                   \
  }
      HANDLE_TYPE(INT32, int32, Int32);
      HANDLE_TYPE(INT64, int64, Int64);
      HANDLE_TYPE(UINT32, uint32, UInt32);
      HANDLE_TYPE(UINT64, uint64, UInt64);
      HANDLE_TYPE(DOUBLE, double, Double);
      HANDLE_TYPE(FLOAT, float, Float);
      HANDLE_TYPE(BOOL, bool, Bool);
      HANDLE_TYPE(STRING, std::string, String);
      HANDLE_TYPE(ENUM, int32, EnumValue);
#undef HANDLE_TYPE
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = reflection->GetMessage(*it, val_des);
        Message* value = message.New(MapFieldBase::arena_);
        value->CopyFrom(message);
        map_val.SetValue(value);
        break;
      }
    }
  }
}